

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

uint get_bits_MSB(cram_block *block,int nbits)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  
  uVar7 = block->bit;
  if (nbits <= (int)(uVar7 + 1)) {
    bVar1 = block->data[block->byte];
    iVar6 = uVar7 - nbits;
    block->bit = iVar6;
    if (iVar6 == -1) {
      block->bit = 7;
      block->byte = block->byte + 1;
    }
    return ~(-1 << ((byte)nbits & 0x1f)) & (uint)(bVar1 >> ((char)iVar6 + 1U & 0x1f));
  }
  switch(nbits) {
  case 1:
    puVar4 = block->data;
    sVar8 = block->byte;
    uVar3 = 0;
    goto LAB_00140fa0;
  case 2:
    puVar4 = block->data;
    sVar8 = block->byte;
    uVar3 = 0;
    goto LAB_00140f75;
  case 3:
    puVar4 = block->data;
    sVar8 = block->byte;
    uVar3 = 0;
    goto LAB_00140f49;
  case 4:
    puVar4 = block->data;
    sVar8 = block->byte;
    uVar3 = 0;
    goto LAB_00140f1e;
  case 5:
    puVar4 = block->data;
    sVar8 = block->byte;
    uVar3 = 0;
    goto LAB_00140ef2;
  case 6:
    puVar4 = block->data;
    sVar8 = block->byte;
    uVar3 = 0;
    goto LAB_00140ec7;
  case 7:
    puVar4 = block->data;
    sVar8 = block->byte;
    uVar3 = 0;
    break;
  case 8:
    puVar4 = block->data;
    bVar1 = puVar4[block->byte];
    bVar5 = (byte)uVar7;
    sVar8 = (ulong)((int)uVar7 < 1) + block->byte;
    block->byte = sVar8;
    uVar7 = uVar7 - 1 & 7;
    block->bit = uVar7;
    uVar3 = (uint)(bVar1 >> (bVar5 & 0x1f)) * 2 & 2;
    break;
  default:
    if (0 < nbits) {
      sVar8 = block->byte;
      uVar3 = 0;
      do {
        uVar3 = (uint)((block->data[sVar8] >> (uVar7 & 0x1f) & 1) != 0) + uVar3 * 2;
        sVar8 = sVar8 + ((int)uVar7 < 1);
        block->byte = sVar8;
        uVar7 = uVar7 - 1 & 7;
        block->bit = uVar7;
        nbits = nbits + -1;
      } while (nbits != 0);
      return uVar3;
    }
    return 0;
  }
  bVar1 = puVar4[sVar8];
  uVar2 = uVar7 & 0x1f;
  sVar8 = ((int)uVar7 < 1) + sVar8;
  block->byte = sVar8;
  uVar7 = uVar7 - 1 & 7;
  block->bit = uVar7;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_00140ec7:
  bVar1 = puVar4[sVar8];
  uVar2 = uVar7 & 0x1f;
  sVar8 = ((int)uVar7 < 1) + sVar8;
  block->byte = sVar8;
  uVar7 = uVar7 - 1 & 7;
  block->bit = uVar7;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_00140ef2:
  bVar1 = puVar4[sVar8];
  uVar2 = uVar7 & 0x1f;
  sVar8 = ((int)uVar7 < 1) + sVar8;
  block->byte = sVar8;
  uVar7 = uVar7 - 1 & 7;
  block->bit = uVar7;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_00140f1e:
  bVar1 = puVar4[sVar8];
  uVar2 = uVar7 & 0x1f;
  sVar8 = ((int)uVar7 < 1) + sVar8;
  block->byte = sVar8;
  uVar7 = uVar7 - 1 & 7;
  block->bit = uVar7;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_00140f49:
  bVar1 = puVar4[sVar8];
  uVar2 = uVar7 & 0x1f;
  sVar8 = ((int)uVar7 < 1) + sVar8;
  block->byte = sVar8;
  uVar7 = uVar7 - 1 & 7;
  block->bit = uVar7;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_00140f75:
  bVar1 = puVar4[sVar8];
  uVar2 = uVar7 & 0x1f;
  sVar8 = ((int)uVar7 < 1) + sVar8;
  block->byte = sVar8;
  uVar7 = uVar7 - 1 & 7;
  block->bit = uVar7;
  uVar3 = ((bVar1 >> uVar2 & 1) != 0 | uVar3) * 2;
LAB_00140fa0:
  bVar1 = puVar4[sVar8];
  block->byte = ((int)uVar7 < 1) + sVar8;
  block->bit = uVar7 - 1 & 7;
  return (bVar1 >> (uVar7 & 0x1f) & 1) != 0 | uVar3;
}

Assistant:

static inline unsigned int get_bits_MSB(cram_block *block, int nbits) {
    unsigned int val = 0;
    int i;

#if 0
    // Fits within the current byte */
    if (nbits <= block->bit+1) {
	val = (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
	if ((block->bit -= nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	return val;
    }

    // partial first byte
    val = block->data[block->byte] & ((1<<(block->bit+1))-1);
    nbits -= block->bit+1;
    block->bit = 7;
    block->byte++;

    // whole middle bytes
    while (nbits >= 8) {
	val = (val << 8) | block->data[block->byte++];
	nbits -= 8;
    }

    val <<= nbits;
    val |= (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
    block->bit -= nbits;
    return val;
#endif

#if 0
    /* Inefficient implementation! */
    //printf("{");
    for (i = 0; i < nbits; i++)
	//val = (val << 1) | get_bit_MSB(block);
	GET_BIT_MSB(block, val);
#endif

#if 1
    /* Combination of 1st two methods */
    if (nbits <= block->bit+1) {
	val = (block->data[block->byte]>>(block->bit-(nbits-1))) & ((1<<nbits)-1);
	if ((block->bit -= nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	}
	return val;
    }

    switch(nbits) {
//    case 15: GET_BIT_MSB(block, val);
//    case 14: GET_BIT_MSB(block, val);
//    case 13: GET_BIT_MSB(block, val);
//    case 12: GET_BIT_MSB(block, val);
//    case 11: GET_BIT_MSB(block, val);
//    case 10: GET_BIT_MSB(block, val);
//    case  9: GET_BIT_MSB(block, val);
    case  8: GET_BIT_MSB(block, val);
    case  7: GET_BIT_MSB(block, val);
    case  6: GET_BIT_MSB(block, val);
    case  5: GET_BIT_MSB(block, val);
    case  4: GET_BIT_MSB(block, val);
    case  3: GET_BIT_MSB(block, val);
    case  2: GET_BIT_MSB(block, val);
    case  1: GET_BIT_MSB(block, val);
	break;

    default:
	for (i = 0; i < nbits; i++)
	    //val = (val << 1) | get_bit_MSB(block);
	    GET_BIT_MSB(block, val);
    }
#endif

    //printf("=0x%x}", val);

    return val;
}